

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1>::
initializeTexCoords(PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1> *this,
                   IVec2 *textureSize,TexCoordParams *texCoordParams,bool useSafeTexCoords)

{
  float fVar1;
  reference pvVar2;
  float fVar3;
  int local_e4;
  int i;
  Vector<float,_3> local_d4;
  Vector<float,_3> local_c8;
  undefined1 local_bc [8];
  Vec3 texCoord;
  Vec2 safeFaceCoord;
  Vector<float,_2> local_a0;
  Vec2 local_98;
  Vec2 rawFaceCoord;
  int x;
  int y;
  Vec3 coordAC;
  Vec3 coordAB;
  Vec3 coordC;
  Vec3 coordB;
  Vec3 coordA;
  undefined1 local_40 [8];
  vector<float,_std::allocator<float>_> texBoundaries;
  float gridSizeFloat;
  bool useSafeTexCoords_local;
  TexCoordParams *texCoordParams_local;
  IVec2 *textureSize_local;
  PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1> *this_local;
  
  texBoundaries.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (float)this->m_gridSize;
  texBoundaries.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = useSafeTexCoords;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  glu::TextureTestUtil::computeQuadTexCoordCube
            ((vector<float,_std::allocator<float>_> *)local_40,texCoordParams->face);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,0);
  fVar3 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,1);
  fVar1 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,2);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(coordB.m_data + 1),fVar3,fVar1,*pvVar2);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,3);
  fVar3 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,4);
  fVar1 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,5);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(coordC.m_data + 1),fVar3,fVar1,*pvVar2);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,6);
  fVar3 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,7);
  fVar1 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_40,8);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(coordAB.m_data + 1),fVar3,fVar1,*pvVar2);
  tcu::operator-((tcu *)(coordAC.m_data + 1),(Vector<float,_3> *)(coordC.m_data + 1),
                 (Vector<float,_3> *)(coordB.m_data + 1));
  tcu::operator-((tcu *)&x,(Vector<float,_3> *)(coordAB.m_data + 1),
                 (Vector<float,_3> *)(coordB.m_data + 1));
  for (rawFaceCoord.m_data[1] = 0.0; (int)rawFaceCoord.m_data[1] < this->m_gridSize;
      rawFaceCoord.m_data[1] = (float)((int)rawFaceCoord.m_data[1] + 1)) {
    for (rawFaceCoord.m_data[0] = 0.0; (int)rawFaceCoord.m_data[0] < this->m_gridSize;
        rawFaceCoord.m_data[0] = (float)((int)rawFaceCoord.m_data[0] + 1)) {
      tcu::Vector<float,_2>::Vector
                (&safeFaceCoord,
                 (float)(int)rawFaceCoord.m_data[0] /
                 texBoundaries.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._0_4_,
                 (float)(int)rawFaceCoord.m_data[1] /
                 texBoundaries.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._0_4_);
      tcu::operator*((tcu *)&local_a0,&texCoordParams->scale,&safeFaceCoord);
      tcu::operator+((tcu *)&local_98,&local_a0,&texCoordParams->bias);
      if ((texBoundaries.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(texCoord.m_data + 1),&local_98);
      }
      else {
        safe2DTexCoords((Functional *)(texCoord.m_data + 1),&local_98,textureSize);
      }
      fVar3 = tcu::Vector<float,_2>::x((Vector<float,_2> *)(texCoord.m_data + 1));
      tcu::operator*((tcu *)&local_d4,(Vector<float,_3> *)&x,fVar3);
      tcu::operator+((tcu *)&local_c8,(Vector<float,_3> *)(coordB.m_data + 1),&local_d4);
      fVar3 = tcu::Vector<float,_2>::y((Vector<float,_2> *)(texCoord.m_data + 1));
      tcu::operator*((tcu *)&stack0xffffffffffffff20,(Vector<float,_3> *)(coordAC.m_data + 1),fVar3)
      ;
      tcu::operator+((tcu *)local_bc,&local_c8,(Vector<float,_3> *)&stack0xffffffffffffff20);
      for (local_e4 = 0; local_e4 < 4; local_e4 = local_e4 + 1) {
        std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                  (&this->m_texCoords,(value_type *)local_bc);
      }
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_40);
  return;
}

Assistant:

void PosTexCoordQuadGrid<TEXTURETYPE_CUBE>::initializeTexCoords (const IVec2& textureSize, const TexCoordParams& texCoordParams, bool useSafeTexCoords)
{
	DE_ASSERT(m_texCoords.empty());

	const float		gridSizeFloat	= (float)m_gridSize;
	vector<float>	texBoundaries;
	computeQuadTexCoordCube(texBoundaries, texCoordParams.face);
	const Vec3		coordA			= Vec3(texBoundaries[0], texBoundaries[1], texBoundaries[2]);
	const Vec3		coordB			= Vec3(texBoundaries[3], texBoundaries[4], texBoundaries[5]);
	const Vec3		coordC			= Vec3(texBoundaries[6], texBoundaries[7], texBoundaries[8]);
	const Vec3		coordAB			= coordB - coordA;
	const Vec3		coordAC			= coordC - coordA;

	for (int y = 0; y < m_gridSize; y++)
	for (int x = 0; x < m_gridSize; x++)
	{
		const Vec2 rawFaceCoord		= texCoordParams.scale * Vec2((float)x / gridSizeFloat, (float)y / gridSizeFloat) + texCoordParams.bias;
		const Vec2 safeFaceCoord	= useSafeTexCoords ? safe2DTexCoords(rawFaceCoord, textureSize) : rawFaceCoord;
		const Vec3 texCoord			= coordA + coordAC*safeFaceCoord.x() + coordAB*safeFaceCoord.y();

		for (int i = 0; i < 4; i++)
			m_texCoords.push_back(texCoord);
	}
}